

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O3

void Gia_ManObjAddToFrontier(Swp_Man_t *p,int Id,Vec_Int_t *vFront)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int Fill;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  
  if (Id != 0) {
    pVVar2 = p->vId2Lit;
    Vec_IntFillExtra(pVVar2,Id + 1,(int)vFront);
    if ((Id < 0) || (pVVar2->nSize <= Id)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (pVVar2->pArray[(uint)Id] == 0) {
      if (p->pGia->nObjs <= Id) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pGia->pObjs + (uint)Id;
      iVar1 = p->nSatVars;
      p->nSatVars = iVar1 + 1;
      if (iVar1 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      uVar4 = iVar1 * 2 | (uint)((ulong)*(undefined8 *)pGVar3 >> 0x3f);
      if (uVar4 == 0) {
        __assert_fail("Lit > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                      ,0x5a,"void Swp_ManSetObj2Lit(Swp_Man_t *, int, int)");
      }
      pVVar2 = p->vId2Lit;
      Vec_IntFillExtra(pVVar2,Id + 1,Fill);
      if (pVVar2->nSize <= Id) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar2->pArray[(uint)Id] = uVar4;
      sat_solver_setnvars(p->pSat,p->nSatVars + 100);
      uVar4 = *(uint *)pGVar3;
      if ((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) {
        Vec_IntPush(vFront,Id);
        return;
      }
    }
  }
  return;
}

Assistant:

static void Gia_ManObjAddToFrontier( Swp_Man_t * p, int Id, Vec_Int_t * vFront )
{
    Gia_Obj_t * pObj;
    if ( Id == 0 || Swp_ManObj2Lit(p, Id) )
        return;
    pObj = Gia_ManObj( p->pGia, Id );
    Swp_ManSetObj2Lit( p, Id, Abc_Var2Lit(p->nSatVars++, pObj->fPhase) );
    sat_solver_setnvars( p->pSat, p->nSatVars + 100 );
    if ( Gia_ObjIsAnd(pObj) )
        Vec_IntPush( vFront, Id );
}